

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entries.cpp
# Opt level: O0

ScalarFunction * duckdb::MapEntriesFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *fun;
  LogicalType *other;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  LogicalType local_a0 [24];
  LogicalType local_88 [24];
  undefined1 local_70 [48];
  LogicalType local_40 [24];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd9af38);
  duckdb::LogicalType::LogicalType(local_40,LIST);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  duckdb::LogicalType::LogicalType(local_88,INVALID);
  this = (LogicalType *)0x0;
  other = (LogicalType *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,&local_28,local_40,local_70,MapEntriesBind,0,0,0,local_88,0,0,0);
  duckdb::LogicalType::~LogicalType(local_88);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd9afdd);
  duckdb::LogicalType::~LogicalType(local_40);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd9aff7);
  in_RDI->field_0xa9 = 1;
  duckdb::LogicalType::LogicalType(local_a0,ANY);
  LogicalType::operator=(this,other);
  duckdb::LogicalType::~LogicalType(local_a0);
  return in_RDI;
}

Assistant:

ScalarFunction MapEntriesFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction fun({}, LogicalTypeId::LIST, MapEntriesFunction, MapEntriesBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.varargs = LogicalType::ANY;
	return fun;
}